

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O1

float __thiscall MILBlob::Fp8E4M3FN::GetFloat(Fp8E4M3FN *this)

{
  byte bVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  
  bVar1 = (this->data).byte;
  fVar2 = (float)((bVar1 & 0xffffff80) * 0x1000000);
  if ((~bVar1 & 0x7f) == 0) {
    return (float)((uint)fVar2 | 0x7f800007);
  }
  fVar4 = fVar2;
  if ((bVar1 & 0x7f) != 0) {
    fVar4 = (float)((int)fVar2 + (bVar1 & 0x7f) * 0x100000 + 0x3c000000);
  }
  if ((bVar1 & 7) == 0 || (bVar1 & 0x78) != 0) {
    return fVar4;
  }
  uVar3 = (int)fVar4 + 0x800000U & 0x7f800000;
  return (float)((uint)fVar4 & 0x807fffff | uVar3) - (float)(uVar3 | (uint)fVar2);
}

Assistant:

float Fp8E4M3FN::GetFloat() const
{
    FloatCast fp32 = {.f = 0};
    // Set the sign bit.
    fp32.components.sign = data.components.sign;
    // NaN case, infinity is not supported. We just use the mantissa from the fp8.
    if (data.components.exponent == (0x1 << fp8ExponentBits) - 1 && data.components.mantissa == 0x7) {
        fp32.components.exponent = 0xFF;
        fp32.components.mantissa = data.components.mantissa;
        return fp32.f;
    }
    HandleFp8ToFp32ExponentMantissa<Fp8E4M3FN, Fp8E4M3FN::Cast>(data, fp32);
    HandleFp8ToFp32Denormalize(data, fp32);
    return fp32.f;
}